

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfSelectClient.cpp
# Opt level: O2

bool __thiscall
xmrig::SelfSelectClient::parseResponse(SelfSelectClient *this,int64_t id,Value *result,Value *error)

{
  undefined8 uVar1;
  Ch *name;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  Type pGVar6;
  uint64_t uVar7;
  Type blob;
  long lVar8;
  
  if (id != -1) {
    if ((error->data_).f.flags == 3) {
      iVar3 = (*(this->super_IClient)._vptr_IClient[10])(this);
      uVar1 = *(undefined8 *)(CONCAT44(extraout_var,iVar3) + 0x70);
      pcVar5 = Json::getString(error,"message",(char *)0x0);
      uVar4 = Json::getInt(error,"code",0);
      Log::print(ERR,"[%s] error: \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m, code: %d",uVar1,pcVar5,
                 (ulong)uVar4);
      return false;
    }
    if ((result->data_).f.flags == 3) {
      lVar8 = 0;
      while (lVar8 != 0x28) {
        name = *(Ch **)((long)&required_fields + lVar8);
        bVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::HasMember(result,name);
        lVar8 = lVar8 + 8;
        if (!bVar2) {
          iVar3 = (*(this->super_IClient)._vptr_IClient[10])(this);
          Log::print(ERR,"[%s] required field \x1b[1;31m\"%s\"\x1b[0m\x1b[0;31m not found",
                     *(undefined8 *)(CONCAT44(extraout_var_00,iVar3) + 0x70),name);
          return false;
        }
      }
      pGVar6 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)result,"blockhashing_blob");
      blob = (Type)((ulong)(pGVar6->data_).s.str & 0xffffffffffff);
      if (((pGVar6->data_).f.flags >> 0xc & 1) != 0) {
        blob = pGVar6;
      }
      bVar2 = Job::setBlob(&this->m_job,(char *)blob);
      if (bVar2) {
        uVar7 = Json::getUint64(result,"height",0);
        (this->m_job).m_height = uVar7;
        submitBlockTemplate(this,result);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool xmrig::SelfSelectClient::parseResponse(int64_t id, rapidjson::Value &result, const rapidjson::Value &error)
{
    if (id == -1) {
        return false;
    }

    if (error.IsObject()) {
        LOG_ERR("[%s] error: " RED_BOLD("\"%s\"") RED_S ", code: %d", pool().daemon().url().data(), Json::getString(error, "message"), Json::getInt(error, "code"));

        return false;
    }

    if (!result.IsObject()) {
        return false;
    }

    for (auto field : required_fields) {
        if (!result.HasMember(field)) {
            LOG_ERR("[%s] required field " RED_BOLD("\"%s\"") RED_S " not found", pool().daemon().url().data(), field);

            return false;
        }
    }

    if (!m_job.setBlob(result[kBlockhashingBlob].GetString())) {
        return false;
    }

    m_job.setHeight(Json::getUint64(result, kHeight));

    submitBlockTemplate(result);

    return true;
}